

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

_Bool MoveToColors(SolStack_t *srcStackPtr)

{
  _Bool _Var1;
  Card_t *pCVar2;
  Card_t *srcCardPtr;
  SolStack_t *srcStackPtr_local;
  
  pCVar2 = stk_CTopCard(srcStackPtr);
  if ((pCVar2 == (Card_t *)0x0) || (_Var1 = IsCardMovableToColors(*pCVar2), !_Var1)) {
    srcStackPtr_local._7_1_ = false;
  }
  else {
    srcStackPtr_local._7_1_ = stk_MoveCardFromTo(srcStackPtr,ColorStacks + pCVar2->m_color);
  }
  return srcStackPtr_local._7_1_;
}

Assistant:

static bool MoveToColors(SolStack_t* srcStackPtr)
{
  const Card_t* srcCardPtr = stk_CTopCard(srcStackPtr);

  if (srcCardPtr && IsCardMovableToColors(*srcCardPtr)) {
    return stk_MoveCardFromTo(srcStackPtr, &ColorStacks[srcCardPtr->m_color]);
  }
  return false;
}